

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func.cpp
# Opt level: O2

void write2file(string *output,double *p_value_dp,int m)

{
  char cVar1;
  ostream *poVar2;
  long lVar3;
  ofstream myfile;
  
  std::ofstream::ofstream(&myfile,(string *)output,_S_out);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    std::operator<<((ostream *)&std::cout,"Unable to open file");
  }
  else {
    poVar2 = std::operator<<((ostream *)&myfile,"k");
    poVar2 = std::operator<<(poVar2,"\t");
    poVar2 = std::operator<<(poVar2,"DP");
    std::endl<char,std::char_traits<char>>(poVar2);
    for (lVar3 = 0; lVar3 <= m; lVar3 = lVar3 + 1) {
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&myfile,(int)lVar3);
      std::operator<<(poVar2,"\t");
      poVar2 = std::ostream::_M_insert<double>(p_value_dp[lVar3]);
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    std::ofstream::close();
  }
  std::ofstream::~ofstream(&myfile);
  return;
}

Assistant:

void write2file(string output, double* p_value_dp, int m)
{
    ofstream myfile (output);
    if (myfile.is_open()) {
        myfile << "k" << "\t" << "DP" << endl;
        for(int k=0; k<=m; k++){
            myfile << k << "\t" << p_value_dp[k] << endl;
        }
        myfile.close();
        }
    else cout << "Unable to open file";
}